

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.cc
# Opt level: O3

bool __thiscall
sptk::StatisticsAccumulation::GetFullCovariance
          (StatisticsAccumulation *this,Buffer *buffer,SymmetricMatrix *full_covariance)

{
  double dVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  double *pdVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int j;
  int column;
  long lVar9;
  vector<double,_std::allocator<double>_> mean;
  long local_a8;
  undefined1 local_98 [32];
  Row local_78;
  SymmetricMatrix *local_60;
  _func_int *local_58;
  _func_int *local_50;
  Row local_48;
  
  if (this->is_valid_ != true) {
    return false;
  }
  if (this->num_statistics_order_ < 2) {
    return false;
  }
  if ((this->diagonal_ == false) &&
     (iVar4 = buffer->zeroth_order_statistics_,
     full_covariance != (SymmetricMatrix *)0x0 && 0 < iVar4)) {
    iVar8 = this->num_order_ + 1;
    if (full_covariance->num_dimension_ != iVar8) {
      SymmetricMatrix::Resize(full_covariance,iVar8);
      iVar4 = buffer->zeroth_order_statistics_;
    }
    if (this->numerically_stable_ == true) {
      if (this->num_order_ < 0) {
        return true;
      }
      iVar6 = 1;
      iVar8 = 0;
      do {
        column = 0;
        do {
          local_98._0_8_ = &PTR__Row_00111d20;
          local_98._16_4_ = iVar8;
          local_98._8_8_ = &buffer->second_order_statistics_;
          pdVar5 = SymmetricMatrix::Row::operator[]((Row *)local_98,column);
          dVar1 = *pdVar5;
          local_78._vptr_Row = (_func_int **)&PTR__Row_00111d20;
          local_78.matrix_ = full_covariance;
          local_78.row_ = iVar8;
          pdVar5 = SymmetricMatrix::Row::operator[](&local_78,column);
          *pdVar5 = dVar1 * (1.0 / (double)iVar4);
          column = column + 1;
        } while (iVar6 != column);
        iVar6 = iVar6 + 1;
        bVar3 = iVar8 < this->num_order_;
        iVar8 = iVar8 + 1;
      } while (bVar3);
    }
    else {
      local_98._0_8_ = (_func_int **)0x0;
      local_98._8_8_ = (SymmetricMatrix *)0x0;
      local_98._16_8_ = (pointer)0x0;
      bVar3 = GetMean(this,buffer,(vector<double,_std::allocator<double>_> *)local_98);
      uVar2 = local_98._0_8_;
      if (!bVar3) {
        if ((_func_int **)local_98._0_8_ != (_func_int **)0x0) {
          operator_delete((void *)local_98._0_8_);
        }
        goto LAB_00105e57;
      }
      if (-1 < this->num_order_) {
        local_a8 = 1;
        lVar7 = 0;
        local_60 = full_covariance;
        do {
          lVar9 = 0;
          do {
            local_78._vptr_Row = (_func_int **)&PTR__Row_00111d20;
            local_78.matrix_ = &buffer->second_order_statistics_;
            local_78.row_ = (int)lVar7;
            pdVar5 = SymmetricMatrix::Row::operator[](&local_78,(int)lVar9);
            dVar1 = *pdVar5;
            local_58 = *(_func_int **)(uVar2 + lVar7 * 8);
            local_50 = *(_func_int **)(uVar2 + lVar9 * 8);
            local_48._vptr_Row = (_func_int **)&PTR__Row_00111d20;
            local_48.matrix_ = local_60;
            local_48.row_ = (int)lVar7;
            pdVar5 = SymmetricMatrix::Row::operator[](&local_48,(int)lVar9);
            *pdVar5 = dVar1 * (1.0 / (double)iVar4) - (double)local_50 * (double)local_58;
            lVar9 = lVar9 + 1;
          } while (local_a8 != lVar9);
          local_a8 = local_a8 + 1;
          bVar3 = lVar7 < this->num_order_;
          lVar7 = lVar7 + 1;
        } while (bVar3);
      }
      if ((_func_int **)local_98._0_8_ != (_func_int **)0x0) {
        operator_delete((void *)local_98._0_8_);
      }
    }
    bVar3 = true;
  }
  else {
LAB_00105e57:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool StatisticsAccumulation::GetFullCovariance(
    const StatisticsAccumulation::Buffer& buffer,
    SymmetricMatrix* full_covariance) const {
  if (!is_valid_ || num_statistics_order_ < 2 || diagonal_ ||
      buffer.zeroth_order_statistics_ <= 0 || NULL == full_covariance) {
    return false;
  }

  if (full_covariance->GetNumDimension() != num_order_ + 1) {
    full_covariance->Resize(num_order_ + 1);
  }

  const double z(1.0 / buffer.zeroth_order_statistics_);

  if (numerically_stable_) {
    for (int i(0); i <= num_order_; ++i) {
      for (int j(0); j <= i; ++j) {
        (*full_covariance)[i][j] = z * buffer.second_order_statistics_[i][j];
      }
    }
  } else {
    std::vector<double> mean;
    if (!GetMean(buffer, &mean)) {
      return false;
    }
    const double* mu(&(mean[0]));
    for (int i(0); i <= num_order_; ++i) {
      for (int j(0); j <= i; ++j) {
        (*full_covariance)[i][j] =
            z * buffer.second_order_statistics_[i][j] - mu[i] * mu[j];
      }
    }
  }

  return true;
}